

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O2

void __thiscall
sparse_parameters::set_default<float,set_initial_wrapper<sparse_parameters>>
          (sparse_parameters *this,float *info)

{
  float *pfVar1;
  
  pfVar1 = calloc_or_throw<float>();
  *pfVar1 = *info;
  this->default_data = pfVar1;
  this->fun = set_initial_wrapper<sparse_parameters>::func;
  *this->default_value = *pfVar1;
  return;
}

Assistant:

void set_default(R& info)
  {
    R& new_R = calloc_or_throw<R>();
    new_R = info;
    default_data = &new_R;
    fun = (void (*)(const weight*, void*))T::func;
    fun(default_value, default_data);
  }